

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

bool __thiscall DataSourceAmiga::check(DataSourceAmiga *this)

{
  int iVar1;
  pointer pbVar2;
  Stream *pSVar3;
  long lVar4;
  bool bVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_122;
  allocator_type local_121;
  DataSourceAmiga *local_120;
  pointer local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  data_files;
  undefined1 local_f0 [32];
  string cp;
  string file_name;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  local_120 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file_name,"gfxheader",(allocator<char> *)&cp);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"gfxfast",(allocator<char> *)local_f0)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"gfxchip",&local_122);
  __l._M_len = 3;
  __l._M_array = &file_name;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&data_files,__l,&local_121);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string(local_90 + lVar4 + -0x20);
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  local_118 = data_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_110 = &(local_120->super_DataSourceLegacy).super_DataSourceBase.path;
  do {
    pbVar2 = data_files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar2 == local_118) break;
    std::__cxx11::string::string((string *)&file_name,(string *)pbVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   local_110,'/');
    std::operator+(&cp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                   ,&file_name);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"data",&local_122);
    Log::Logger::operator[]((Logger *)local_f0,(string *)&Log::Info);
    pSVar3 = Log::Stream::operator<<((Stream *)local_f0,"Looking for game data in \'");
    pSVar3 = Log::Stream::operator<<(pSVar3,&cp);
    Log::Stream::operator<<(pSVar3,"\'...");
    Log::Stream::~Stream((Stream *)local_f0);
    std::__cxx11::string::~string(local_50);
    iVar1 = (*(local_120->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source
              [0xe])(local_120,&cp);
    std::__cxx11::string::~string((string *)&cp);
    std::__cxx11::string::~string((string *)&file_name);
    data_files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar2 + 1;
  } while ((char)iVar1 != '\0');
  bVar5 = pbVar2 == local_118;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&data_files);
  return bVar5;
}

Assistant:

bool
DataSourceAmiga::check() {
  std::vector<std::string> data_files = {
    "gfxheader",  // catalog file
    "gfxfast",    // fast graphics file
    "gfxchip"     // chip graphics file
  };

  for (std::string file_name : data_files) {
    std::string cp = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << cp << "'...";
    if (!check_file(cp)) {
      return false;
    }
  }

  return true;
}